

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_sha1_write(fio_sha1_s *s,void *data,size_t len)

{
  ulong uVar1;
  ulong __n;
  
  uVar1 = (ulong)((uint)s->length & 0x3f);
  __n = 0x40 - uVar1;
  s->length = s->length + len;
  if (__n <= len) {
    if (uVar1 != 0) {
      memcpy(s->buffer + uVar1,data,__n);
      data = (void *)((long)data + __n);
      fio_sha1_perform_all_rounds(s,s->buffer);
      len = len - __n;
    }
    for (; 0x3f < len; len = len - 0x40) {
      fio_sha1_perform_all_rounds(s,(uint8_t *)data);
      data = (void *)((long)data + 0x40);
    }
    if (len == 0) {
      return;
    }
  }
  memcpy(s->buffer + uVar1,data,len);
  return;
}

Assistant:

void fio_sha1_write(fio_sha1_s *s, const void *data, size_t len) {
  size_t in_buffer = s->length & 63;
  size_t partial = 64 - in_buffer;
  s->length += len;
  if (partial > len) {
    memcpy(s->buffer + in_buffer, data, len);
    return;
  }
  if (in_buffer) {
    memcpy(s->buffer + in_buffer, data, partial);
    len -= partial;
    data = (void *)((uintptr_t)data + partial);
    fio_sha1_perform_all_rounds(s, s->buffer);
  }
  while (len >= 64) {
    fio_sha1_perform_all_rounds(s, data);
    data = (void *)((uintptr_t)data + 64);
    len -= 64;
  }
  if (len) {
    memcpy(s->buffer + in_buffer, data, len);
  }
  return;
}